

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxReLeave(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,int leave,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,bool polish)

{
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar1;
  undefined8 uVar2;
  int iVar3;
  Status SVar4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  long lVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  pointer pnVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  pointer pnVar11;
  byte bVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [13];
  undefined3 uStack_34b;
  undefined5 uStack_348;
  undefined8 local_340;
  cpp_dec_float<200U,_int,_void> local_330;
  cpp_dec_float<200U,_int,_void> local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar12 = 0;
  if (leave < 0) goto LAB_005ba330;
  pSVar5 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pUVar1 = pSVar5->theFvec;
  pnVar11 = (pSVar5->theUBbound).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pnVar11[(uint)leave].m_backend.fpclass == cpp_dec_float_NaN) ||
     (pnVar8 = (pSVar5->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     pnVar8[(uint)leave].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_005ba294:
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)sel,0.0);
    if (polish) goto LAB_005ba330;
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar11 = (pUVar1->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar8 = pnVar11 + (uint)leave;
    pnVar7 = &local_1b0;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar7->m_backend).data._M_elems[0] = *(uint *)&pnVar8->m_backend;
      pnVar8 = (pointer)((long)pnVar8 + ((ulong)bVar12 * -2 + 1) * 4);
      pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar7 + ((ulong)bVar12 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = *(int *)((long)(pnVar11 + (uint)leave) + 0x70);
    local_1b0.m_backend.neg = *(bool *)((long)(pnVar11 + (uint)leave) + 0x74);
    local_1b0.m_backend._120_8_ = *(undefined8 *)((long)(pnVar11 + (uint)leave) + 0x78);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shiftLBbound(pSVar5,leave,&local_1b0);
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar11 = (pUVar1->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar7 = &local_230;
  }
  else {
    iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&pnVar11[(uint)leave].m_backend,&pnVar8[(uint)leave].m_backend);
    if (iVar3 < 1) goto LAB_005ba294;
    pnVar11 = (pUVar1->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar8 = pnVar11 + (uint)leave;
    pcVar9 = &local_2b0;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pcVar9->data)._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
      pnVar8 = (pointer)((long)pnVar8 + ((ulong)bVar12 * -2 + 1) * 4);
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + ((ulong)bVar12 * -2 + 1) * 4);
    }
    local_2b0.exp = pnVar11[(uint)leave].m_backend.exp;
    local_2b0.neg = pnVar11[(uint)leave].m_backend.neg;
    uVar2._0_4_ = pnVar11[(uint)leave].m_backend.fpclass;
    uVar2._4_4_ = pnVar11[(uint)leave].m_backend.prec_elem;
    pnVar7 = &this->fastDelta;
    pcVar9 = &local_330;
    local_2b0._120_8_ = uVar2;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pcVar9->data)._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
      pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar7 + (ulong)bVar12 * -8 + 4);
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + ((ulong)bVar12 * -2 + 1) * 4);
    }
    local_330.exp = (this->fastDelta).m_backend.exp;
    local_330.neg = (this->fastDelta).m_backend.neg;
    local_330.fpclass = (this->fastDelta).m_backend.fpclass;
    local_330.prec_elem = (this->fastDelta).m_backend.prec_elem;
    if (local_330.fpclass != cpp_dec_float_finite || local_330.data._M_elems[0] != 0) {
      local_330.neg = (bool)(local_330.neg ^ 1);
    }
    local_340._0_4_ = cpp_dec_float_finite;
    local_340._4_4_ = 0x1c;
    local_3b8 = (undefined1  [16])0x0;
    local_3a8 = (undefined1  [16])0x0;
    local_398 = (undefined1  [16])0x0;
    local_388 = (undefined1  [16])0x0;
    local_378 = (undefined1  [16])0x0;
    local_368 = (undefined1  [16])0x0;
    local_358 = SUB1613((undefined1  [16])0x0,0);
    uStack_34b = 0;
    uStack_348._0_4_ = 0;
    uStack_348._4_1_ = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)local_3b8,&local_330,&maxabs->m_backend);
    if (((sel->m_backend).fpclass == cpp_dec_float_NaN) ||
       ((fpclass_type)local_340 == cpp_dec_float_NaN)) goto LAB_005ba330;
    iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&sel->m_backend,(cpp_dec_float<200U,_int,_void> *)local_3b8);
    if (-1 < iVar3) goto LAB_005ba330;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)sel,0.0);
    if (polish) goto LAB_005ba330;
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    SVar4 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dualStatus(&pSVar5->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ,(pSVar5->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).theBaseId.data + (uint)leave);
    if (SVar4 == D_ON_BOTH) goto LAB_005ba330;
    if ((fpclass_type)uVar2 != cpp_dec_float_NaN) {
      local_340._0_4_ = cpp_dec_float_finite;
      local_340._4_4_ = 0x1c;
      local_3b8 = (undefined1  [16])0x0;
      local_3a8 = (undefined1  [16])0x0;
      local_398 = (undefined1  [16])0x0;
      local_388 = (undefined1  [16])0x0;
      local_378 = (undefined1  [16])0x0;
      local_368 = (undefined1  [16])0x0;
      local_358 = SUB1613((undefined1  [16])0x0,0);
      uStack_34b = 0;
      uStack_348._0_4_ = 0;
      uStack_348._4_1_ = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_3b8,0.0);
      iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&local_2b0,(cpp_dec_float<200U,_int,_void> *)local_3b8);
      if (iVar3 < 0) {
        pSVar5 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        pnVar11 = (pUVar1->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar8 = pnVar11 + (uint)leave;
        pnVar7 = &local_b0;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pnVar7->m_backend).data._M_elems[0] = *(uint *)&pnVar8->m_backend;
          pnVar8 = (pointer)((long)pnVar8 + ((ulong)bVar12 * -2 + 1) * 4);
          pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar7 + ((ulong)bVar12 * -2 + 1) * 4);
        }
        local_b0.m_backend.exp = *(int *)((long)(pnVar11 + (uint)leave) + 0x70);
        local_b0.m_backend.neg = *(bool *)((long)(pnVar11 + (uint)leave) + 0x74);
        local_b0.m_backend._120_8_ = *(undefined8 *)((long)(pnVar11 + (uint)leave) + 0x78);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::shiftLBbound(pSVar5,leave,&local_b0);
        goto LAB_005ba330;
      }
    }
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar11 = (pUVar1->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar7 = &local_130;
  }
  pnVar8 = pnVar11 + (uint)leave;
  pnVar10 = pnVar7;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar10->m_backend).data._M_elems[0] = *(uint *)&pnVar8->m_backend;
    pnVar8 = (pointer)((long)pnVar8 + ((ulong)bVar12 * -2 + 1) * 4);
    pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar10 + ((ulong)bVar12 * -2 + 1) * 4);
  }
  (pnVar7->m_backend).exp = *(int *)((long)(pnVar11 + (uint)leave) + 0x70);
  (pnVar7->m_backend).neg = *(bool *)((long)(pnVar11 + (uint)leave) + 0x74);
  uVar2 = *(undefined8 *)((long)(pnVar11 + (uint)leave) + 0x78);
  (pnVar7->m_backend).fpclass = (int)uVar2;
  (pnVar7->m_backend).prec_elem = (int)((ulong)uVar2 >> 0x20);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::shiftUBbound(pSVar5,leave,pnVar7);
LAB_005ba330:
  return SUB41((uint)leave >> 0x1f,0);
}

Assistant:

bool SPxFastRT<R>::maxReLeave(R& sel, int leave, R maxabs, bool polish)
{
   UpdateVector<R>& vec = this->thesolver->fVec();
   VectorBase<R>& low = this->thesolver->lbBound();
   VectorBase<R>& up = this->thesolver->ubBound();

   if(leave < 0)
      return true;

   if(up[leave] > low[leave])
   {
      R x = vec.delta()[leave];

      if(sel < -fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish
               && this->thesolver->dualStatus(this->thesolver->baseId(leave)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
         {
            if(x < 0.0)
               this->thesolver->shiftLBbound(leave, vec[leave]);
            else
               this->thesolver->shiftUBbound(leave, vec[leave]);
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         this->thesolver->shiftLBbound(leave, vec[leave]);
         this->thesolver->shiftUBbound(leave, vec[leave]);
      }
   }

   return false;
}